

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_document_append_sequence_item(yaml_document_t *document,int sequence,int item)

{
  yaml_node_t *pyVar1;
  yaml_node_t *pyVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x53e,"int yaml_document_append_sequence_item(yaml_document_t *, int, int)");
  }
  if (0 < sequence) {
    pyVar1 = (document->nodes).start;
    pyVar2 = (document->nodes).top;
    if (pyVar1 + (uint)sequence <= pyVar2) {
      uVar5 = sequence - 1;
      if (pyVar1[uVar5].type != YAML_SEQUENCE_NODE) {
        __assert_fail("document->nodes.start[sequence-1].type == YAML_SEQUENCE_NODE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                      ,0x542,"int yaml_document_append_sequence_item(yaml_document_t *, int, int)");
      }
      if ((0 < item) && (pyVar1 + (uint)item <= pyVar2)) {
        if ((pyVar1[uVar5].data.sequence.items.top ==
             (yaml_node_item_t *)pyVar1[uVar5].data.scalar.length) &&
           (iVar4 = yaml_stack_extend((void **)&pyVar1[uVar5].data,
                                      (void **)((long)&pyVar1[uVar5].data + 0x10),
                                      (void **)&pyVar1[uVar5].data.scalar.length), iVar4 == 0)) {
          return 0;
        }
        pyVar1 = (document->nodes).start;
        piVar3 = pyVar1[uVar5].data.sequence.items.top;
        pyVar1[uVar5].data.sequence.items.top = piVar3 + 1;
        *piVar3 = item;
        return 1;
      }
      __assert_fail("item > 0 && document->nodes.start + item <= document->nodes.top",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                    ,0x544,"int yaml_document_append_sequence_item(yaml_document_t *, int, int)");
    }
  }
  __assert_fail("sequence > 0 && document->nodes.start + sequence <= document->nodes.top",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x540,"int yaml_document_append_sequence_item(yaml_document_t *, int, int)");
}

Assistant:

YAML_DECLARE(int)
yaml_document_append_sequence_item(yaml_document_t *document,
        int sequence, int item)
{
    struct {
        yaml_error_type_t error;
    } context;

    assert(document);       /* Non-NULL document is required. */
    assert(sequence > 0
            && document->nodes.start + sequence <= document->nodes.top);
                            /* Valid sequence id is required. */
    assert(document->nodes.start[sequence-1].type == YAML_SEQUENCE_NODE);
                            /* A sequence node is required. */
    assert(item > 0 && document->nodes.start + item <= document->nodes.top);
                            /* Valid item id is required. */

    if (!PUSH(&context,
                document->nodes.start[sequence-1].data.sequence.items, item))
        return 0;

    return 1;
}